

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_compute.cpp
# Opt level: O2

void create_command_pool(Init *init,Data *data)

{
  uint uVar1;
  anon_union_24_2_293c120a_for_Result<unsigned_int>_1 local_58;
  undefined8 local_40;
  VkCommandPoolCreateInfo pool_info;
  
  pool_info.flags = 0;
  pool_info.queueFamilyIndex = 0;
  pool_info.pNext = (void *)0x0;
  pool_info.sType = VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO;
  pool_info._4_4_ = 0;
  vkb::Device::get_queue_index((Result<unsigned_int> *)&local_58.m_error,&init->device,graphics);
  uVar1 = vkb::Result<unsigned_int>::value((Result<unsigned_int> *)&local_58.m_error);
  pool_info.queueFamilyIndex = uVar1;
  vkb::DispatchTable::createCommandPool
            (&init->disp,&pool_info,(VkAllocationCallbacks *)0x0,&data->command_pool);
  local_58.m_error.type._M_cat = (error_category *)0x0;
  local_58._0_8_ = 0x28;
  local_58._16_8_ = data->command_pool;
  local_40 = 0x100000000;
  vkb::DispatchTable::allocateCommandBuffers
            (&init->disp,(VkCommandBufferAllocateInfo *)&local_58.m_error,&data->command_buffer);
  return;
}

Assistant:

void create_command_pool(Init& init, Data& data) {
    VkCommandPoolCreateInfo pool_info = {};
    pool_info.sType = VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO;
    pool_info.queueFamilyIndex = init.device.get_queue_index(vkb::QueueType::graphics).value();
    init.disp.createCommandPool(&pool_info, nullptr, &data.command_pool);

    VkCommandBufferAllocateInfo allocate_info = {};
    allocate_info.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO;
    allocate_info.commandPool = data.command_pool;
    allocate_info.level = VK_COMMAND_BUFFER_LEVEL_PRIMARY;
    allocate_info.commandBufferCount = 1;
    init.disp.allocateCommandBuffers(&allocate_info, &data.command_buffer);
}